

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O3

int __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveSparse(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  int iVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  int local_ec;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_a8.data._M_elems._32_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 8);
  local_a8.data._M_elems._0_8_ =
       *(undefined8 *)
        (this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thetolerance.m_backend.data._M_elems;
  local_a8.data._M_elems._8_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 2);
  local_a8.data._M_elems._16_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 4);
  local_a8.data._M_elems._24_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 6);
  local_a8.exp = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend.exp;
  local_a8.neg = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend.neg;
  local_a8.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_a8.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  if (local_a8.fpclass != cpp_dec_float_finite || local_a8.data._M_elems[0] != 0) {
    local_a8.neg = (bool)(local_a8.neg ^ 1);
  }
  lVar8 = (long)(((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->infeasibilities).super_IdxSet.num;
  if (lVar8 < 1) {
    local_ec = -1;
  }
  else {
    uVar9 = lVar8 + 1;
    local_ec = -1;
    do {
      pSVar6 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      pnVar3 = (pSVar6->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = (pSVar6->infeasibilities).super_IdxSet.idx;
      iVar2 = piVar7[uVar9 - 2];
      local_e8.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_e8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_e8.exp = pnVar3[iVar2].m_backend.exp;
      local_e8.neg = pnVar3[iVar2].m_backend.neg;
      local_e8.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_e8.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      local_68.data._M_elems._32_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 8);
      local_68.data._M_elems._0_8_ =
           *(undefined8 *)
            (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance.m_backend.data._M_elems;
      local_68.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 2);
      local_68.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 4);
      local_68.data._M_elems._24_8_ =
           *(undefined8 *)
            ((this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.data._M_elems + 6);
      local_68.exp = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.exp;
      local_68.neg = (this->
                     super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thetolerance.m_backend.neg;
      local_68.fpclass =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.fpclass;
      local_68.prec_elem =
           (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thetolerance.m_backend.prec_elem;
      if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
        local_68.neg = (bool)(local_68.neg ^ 1);
      }
      if (local_e8.fpclass == cpp_dec_float_NaN || local_68.fpclass == cpp_dec_float_NaN) {
LAB_002c7530:
        iVar5 = (pSVar6->infeasibilities).super_IdxSet.num;
        (pSVar6->infeasibilities).super_IdxSet.num = iVar5 + -1;
        piVar7[uVar9 - 2] = piVar7[(long)iVar5 + -1];
        (pSVar6->isInfeasible).data[iVar2] = 0;
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_e8,&local_68);
        if (-1 < iVar5) {
          pSVar6 = (this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver;
          piVar7 = (pSVar6->infeasibilities).super_IdxSet.idx;
          goto LAB_002c7530;
        }
        if (((local_e8.fpclass != cpp_dec_float_NaN) && (local_a8.fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_e8,&local_a8), iVar5 < 0)) {
          local_a8.data._M_elems[8] = local_e8.data._M_elems[8];
          local_a8.data._M_elems[9] = local_e8.data._M_elems[9];
          local_a8.data._M_elems[0] = local_e8.data._M_elems[0];
          local_a8.data._M_elems[1] = local_e8.data._M_elems[1];
          local_a8.data._M_elems[2] = local_e8.data._M_elems[2];
          local_a8.data._M_elems[3] = local_e8.data._M_elems[3];
          local_a8.data._M_elems[4] = local_e8.data._M_elems[4];
          local_a8.data._M_elems[5] = local_e8.data._M_elems[5];
          local_a8.data._M_elems[7]._1_3_ = local_e8.data._M_elems[7]._1_3_;
          local_a8.data._M_elems._24_5_ = local_e8.data._M_elems._24_5_;
          local_a8.exp = local_e8.exp;
          local_a8.neg = local_e8.neg;
          local_a8.fpclass = local_e8.fpclass;
          local_a8.prec_elem = local_e8.prec_elem;
          local_ec = iVar2;
        }
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return local_ec;
}

Assistant:

int SPxDantzigPR<R>::selectLeaveSparse()
{
   assert(this->thesolver != nullptr);

   R best   = -this->thetolerance;
   R x;
   int  n      = -1;
   int  index;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      index = this->thesolver->infeasibilities.index(i);
      x = this->thesolver->fTest()[index];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            n    = index;
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[index] > 0);
         this->thesolver->isInfeasible[index] = 0;
      }
   }

   return n;
}